

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

ptrdiff_t perfetto::Category::GetNthNameSize(int n,char *start,char *end,int counter)

{
  char cVar1;
  char *pcVar2;
  ptrdiff_t pVar3;
  long lVar4;
  
  while( true ) {
    lVar4 = (long)end - (long)start;
    pcVar2 = end;
    while( true ) {
      end = pcVar2 + 1;
      cVar1 = *pcVar2;
      if ((cVar1 == ',') || (cVar1 == '\0')) break;
      lVar4 = lVar4 + 1;
      pcVar2 = end;
    }
    if ((counter == n) || (cVar1 == '\0')) break;
    counter = counter + 1;
    start = end;
  }
  pVar3 = 0;
  if (counter == n) {
    pVar3 = lVar4;
  }
  return pVar3;
}

Assistant:

static constexpr ptrdiff_t GetNthNameSize(int n,
                                            const char* start,
                                            const char* end,
                                            int counter = 0) {
    return (!*end || *end == ',')
               ? ((!*end || counter == n)
                      ? (counter == n ? end - start : 0)
                      : GetNthNameSize(n, end + 1, end + 1, counter + 1))
               : GetNthNameSize(n, start, end + 1, counter);
  }